

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O2

Storage * __thiscall llvm::APFloat::Storage::operator=(Storage *this,Storage *RHS)

{
  if (*(undefined1 **)this == semPPCDoubleDouble) {
    if (RHS->semantics == (fltSemantics *)semPPCDoubleDouble) {
      detail::DoubleAPFloat::operator=((DoubleAPFloat *)this,(DoubleAPFloat *)&RHS->IEEE);
      return (Storage *)this;
    }
  }
  else if (RHS->semantics != (fltSemantics *)semPPCDoubleDouble) {
    detail::IEEEFloat::operator=((IEEEFloat *)this,&RHS->IEEE);
    return (Storage *)this;
  }
  if ((Storage *)this != RHS) {
    ~Storage(this);
    Storage(this,RHS);
  }
  return (Storage *)this;
}

Assistant:

Storage &operator=(Storage &&RHS) {
      if (usesLayout<IEEEFloat>(*semantics) &&
          usesLayout<IEEEFloat>(*RHS.semantics)) {
        IEEE = std::move(RHS.IEEE);
      } else if (usesLayout<DoubleAPFloat>(*semantics) &&
                 usesLayout<DoubleAPFloat>(*RHS.semantics)) {
        Double = std::move(RHS.Double);
      } else if (this != &RHS) {
        this->~Storage();
        new (this) Storage(std::move(RHS));
      }
      return *this;
    }